

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

char * __thiscall XMLParser::XMLNode::getAttribute(XMLNode *this,char *name,int j)

{
  uint in_EAX;
  char *pcVar1;
  int iVar2;
  int i;
  undefined8 uStack_28;
  
  if (this->d != (XMLNodeData *)0x0) {
    uStack_28 = (ulong)in_EAX;
    if (0 < j) {
      iVar2 = j + 1;
      do {
        getAttribute(this,name,(int *)((long)&uStack_28 + 4));
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    pcVar1 = getAttribute(this,name,(int *)((long)&uStack_28 + 4));
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

XMLCSTR XMLNode::getAttribute(XMLCSTR name, int j) const
    {
        if(!d)
            return NULL;
        int i = 0;
        while(j-- > 0)
            getAttribute(name, &i);
        return getAttribute(name, &i);
    }